

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ciphers.c
# Opt level: O1

void warn_if_untested(EVP_CIPHER *ciph,void *provider)

{
  char *pcVar1;
  int iVar2;
  void *pvVar3;
  undefined8 uVar4;
  testcase *ptVar5;
  
  pvVar3 = (void *)EVP_CIPHER_get0_provider();
  if (pvVar3 == provider) {
    iVar2 = EVP_CIPHER_is_a(ciph,"kuznyechik-ecb");
    if (iVar2 == 0) {
      ptVar5 = testcases;
      do {
        ptVar5 = ptVar5 + 1;
        pcVar1 = ptVar5->algname;
        if (pcVar1 == (char *)0x0) goto LAB_00102428;
        iVar2 = EVP_CIPHER_is_a(ciph,pcVar1);
      } while (iVar2 == 0);
      if (pcVar1 == (char *)0x0) {
LAB_00102428:
        uVar4 = EVP_CIPHER_get0_name(ciph);
        printf("\x1b[1;35mCipher %s is untested!\x1b[m\n",uVar4);
        return;
      }
    }
  }
  return;
}

Assistant:

void warn_if_untested(const EVP_CIPHER *ciph, void *provider)
{
    const struct testcase *t;

    /* ENGINE provided EVP_MDs have a NULL provider */
    if (provider != EVP_CIPHER_get0_provider(ciph))
        return;

    for (t = testcases; t->algname; t++)
        if (EVP_CIPHER_is_a(ciph, t->algname))
            break;
    if (!t->algname)
        printf(cMAGENT "Cipher %s is untested!" cNORM "\n", EVP_CIPHER_name(ciph));
}